

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

QUuid __thiscall VcprojGenerator::getProjectUUID(VcprojGenerator *this,QString *filename)

{
  QMakeProject *pQVar1;
  long lVar2;
  QUuid QVar3;
  FILE *__stream;
  bool bVar4;
  bool bVar5;
  char16_t *pcVar6;
  QArrayDataPointer<ProString> *this_00;
  long in_FS_OFFSET;
  QStringView QVar7;
  undefined1 auVar8 [16];
  QAnyStringView QVar9;
  QByteArrayView QVar10;
  ProKey local_158;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_110;
  ProString local_f8;
  QArrayDataPointer<ProString> local_c0;
  ProKey local_a8;
  ProString local_78;
  QUuid local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.data1 = 0xaaaaaaaa;
  local_48.data2 = 0xaaaa;
  local_48.data3 = 0xaaaa;
  local_48.data4[0] = 0xaa;
  local_48.data4[1] = 0xaa;
  local_48.data4[2] = 0xaa;
  local_48.data4[3] = 0xaa;
  local_48.data4[4] = 0xaa;
  local_48.data4[5] = 0xaa;
  local_48.data4[6] = 0xaa;
  local_48.data4[7] = 0xaa;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_a8,"GUID");
  QMakeEvaluator::first(&local_78,&pQVar1->super_QMakeEvaluator,&local_a8);
  local_f8.m_string.d.d = (Data *)local_78.m_string.d.size;
  local_f8.m_string.d.ptr = local_78.m_string.d.ptr;
  QVar7 = QStringView::mid((QStringView *)&local_f8,(long)local_78.m_offset,(long)local_78.m_length)
  ;
  QVar9.m_size = QVar7.m_size | 0x8000000000000000;
  QVar9.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QVar7.m_data;
  auVar8 = QUuid::fromString(QVar9);
  local_48.data1 = auVar8._0_4_;
  local_48.data2 = auVar8._4_2_;
  local_48.data3 = auVar8._6_2_;
  local_48.data4._0_4_ = auVar8._8_4_;
  local_48.data4._4_4_ = auVar8._12_4_;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  bVar4 = QUuid::isNull(&local_48);
  lVar2 = (filename->d).size;
  if ((bVar4) || (lVar2 != 0)) {
    local_f8.m_string.d.size = -0x5555555555555556;
    local_f8.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_f8.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    if (lVar2 == 0) {
      pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey(&local_a8,"QMAKE_MAKEFILE");
      QMakeEvaluator::first(&local_78,&pQVar1->super_QMakeEvaluator,&local_a8);
      ProString::toQString((QString *)&local_158,&local_78);
    }
    else {
      local_158.super_ProString.m_string.d.d = (filename->d).d;
      local_158.super_ProString.m_string.d.ptr = (filename->d).ptr;
      local_158.super_ProString.m_string.d.size = lVar2;
      if (local_158.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    Option::fixPathToTargetOS(&local_f8.m_string,(QString *)&local_158,true,true);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
    if (lVar2 == 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    }
    local_158.super_ProString.m_string.d.size = -0x5555555555555556;
    local_158.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_158.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QString::toUtf8_helper((QString *)&local_c0);
    QVar10.m_data = (storage_type *)local_c0.size;
    QVar10.m_size = (qsizetype)&local_158;
    QCryptographicHash::hash(QVar10,(Algorithm)local_c0.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c0);
    pcVar6 = local_158.super_ProString.m_string.d.ptr;
    if (local_158.super_ProString.m_string.d.ptr == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QByteArray::_empty;
    }
    local_48.data1 = *(uint *)pcVar6;
    local_48.data4._0_4_ = *(undefined4 *)(pcVar6 + 4);
    local_48.data4._4_4_ = *(undefined4 *)(pcVar6 + 6);
    local_48.data2 = (ushort)*(undefined4 *)(pcVar6 + 2);
    local_48.data3 = (ushort)((uint)*(undefined4 *)(pcVar6 + 2) >> 0x10);
    bVar4 = QUuid::isNull(&local_48);
    local_48.data4._0_4_ = local_48.data4._0_4_ & 0xffffff3f | 0x80;
    local_48.data3 = local_48.data3 & 0xfff | 0x3000;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  }
  else {
    bVar4 = false;
  }
  bVar5 = QUuid::isNull(&local_48);
  if ((bVar4 != false) || (bVar5)) {
    auVar8 = QUuid::createUuid();
    __stream = _stderr;
    local_48.data1 = auVar8._0_4_;
    local_48.data2 = auVar8._4_2_;
    local_48.data3 = auVar8._6_2_;
    local_48.data4._0_4_ = auVar8._8_4_;
    local_48.data4._4_4_ = auVar8._12_4_;
    QUuid::toString((StringFormat)&local_c0);
    QString::toUpper_helper((QString *)&local_158);
    QString::toLatin1_helper_inplace((QString *)&local_f8);
    pcVar6 = local_f8.m_string.d.ptr;
    if (local_f8.m_string.d.ptr == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QByteArray::_empty;
    }
    fprintf(__stream,
            "qmake couldn\'t create a GUID based on filepath, and we couldn\'t\nfind a valid GUID in the .pro file (Consider adding\n\'GUID = %s\'  to the .pro file)\n"
            ,pcVar6);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c0);
  }
  QUuid::toString((StringFormat)&local_128);
  QString::toUpper_helper((QString *)&local_110);
  ProString::ProString(&local_f8,(QString *)&local_110);
  ProStringList::ProStringList((ProStringList *)&local_c0,&local_f8);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_158,"GUID");
  this_00 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_158);
  QArrayDataPointer<ProString>::operator=(this_00,&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  QVar3.data2 = local_48.data2;
  QVar3.data1 = local_48.data1;
  QVar3.data3 = local_48.data3;
  QVar3.data4[0] = local_48.data4[0];
  QVar3.data4[1] = local_48.data4[1];
  QVar3.data4[2] = local_48.data4[2];
  QVar3.data4[3] = local_48.data4[3];
  QVar3.data4[4] = local_48.data4[4];
  QVar3.data4[5] = local_48.data4[5];
  QVar3.data4[6] = local_48.data4[6];
  QVar3.data4[7] = local_48.data4[7];
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QUuid VcprojGenerator::getProjectUUID(const QString &filename)
{
    bool validUUID = true;

    // Read GUID from variable-space
    auto uuid = QUuid::fromString(project->first("GUID").toQStringView());

    // If none, create one based on the MD5 of absolute project path
    if(uuid.isNull() || !filename.isEmpty()) {
        QString abspath = Option::fixPathToTargetOS(
                    filename.isEmpty() ? project->first("QMAKE_MAKEFILE").toQString() : filename);
        QByteArray digest = QCryptographicHash::hash(abspath.toUtf8(), QCryptographicHash::Sha1);
        memcpy((unsigned char*)(&uuid), digest.constData(), sizeof(QUuid));
        validUUID = !uuid.isNull();
        uuid.data4[0] = (uuid.data4[0] & 0x3F) | 0x80; // UV_DCE variant
        uuid.data3 = (uuid.data3 & 0x0FFF) | (QUuid::Name<<12);
    }

    // If still not valid, generate new one, and suggest adding to .pro
    if(uuid.isNull() || !validUUID) {
        uuid = QUuid::createUuid();
        fprintf(stderr,
                "qmake couldn't create a GUID based on filepath, and we couldn't\nfind a valid GUID in the .pro file (Consider adding\n'GUID = %s'  to the .pro file)\n",
                uuid.toString().toUpper().toLatin1().constData());
    }

    // Store GUID in variable-space
    project->values("GUID") = ProStringList(uuid.toString().toUpper());
    return uuid;
}